

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks.c
# Opt level: O3

CURLcode socks_proxy_cf_connect(Curl_cfilter *cf,Curl_easy *data,_Bool blocking,_Bool *done)

{
  uchar *puVar1;
  connectdata *conn;
  connectdata *pcVar2;
  sockaddr *psVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  _Bool _Var7;
  ushort uVar8;
  CURLcode CVar9;
  uint uVar10;
  int iVar11;
  resolve_t rVar12;
  CURLproxycode CVar13;
  socks_state *sx;
  long lVar14;
  size_t sVar15;
  ssize_t sVar16;
  size_t sVar17;
  size_t __n;
  uchar uVar18;
  int code;
  connect_t cVar19;
  ulong uVar20;
  Curl_addrinfo *pCVar21;
  char *pcVar22;
  char *pcVar23;
  byte bVar24;
  ulong uVar25;
  Curl_dns_entry *dns;
  ulong local_a8;
  size_t local_a0;
  connectdata *local_98;
  uchar ip4 [4];
  char dest [46];
  
  if ((cf->field_0x24 & 1) != 0) {
    CVar9 = CURLE_OK;
    _Var7 = true;
    goto LAB_00635e97;
  }
  sx = (socks_state *)cf->ctx;
  conn = cf->conn;
  iVar11 = cf->sockindex;
  CVar9 = (*cf->next->cft->do_connect)(cf->next,data,blocking,done);
  if (CVar9 != CURLE_OK) {
    return CVar9;
  }
  if (*done != true) {
    return CURLE_OK;
  }
  if (sx == (socks_state *)0x0) {
    sx = (socks_state *)(*Curl_ccalloc)(1,0x290);
    if (sx == (socks_state *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    cf->ctx = sx;
  }
  cVar19 = sx->state;
  if (cVar19 == CONNECT_INIT) {
    sx->state = CONNECT_SOCKS_INIT;
    lVar14 = 0xd8;
    if (((((uint)conn->bits & 1) == 0) && (lVar14 = 0x80, ((uint)conn->bits >> 9 & 1) == 0)) &&
       (lVar14 = 0x50, iVar11 == 1)) {
      sx->hostname = conn->secondaryhostname;
      if (((uint)conn->bits & 1) == 0) {
LAB_00635ecc:
        uVar10 = (uint)conn->secondary_port;
      }
      else {
LAB_00635ed5:
        uVar10 = (conn->http_proxy).port;
      }
    }
    else {
      sx->hostname = *(char **)((long)&(conn->bundle_node).ptr + lVar14);
      if (((uint)conn->bits & 1) != 0) goto LAB_00635ed5;
      if (iVar11 == 1) goto LAB_00635ecc;
      if (((uint)conn->bits >> 10 & 1) == 0) {
        uVar10 = conn->remote_port;
      }
      else {
        uVar10 = conn->conn_to_port;
      }
    }
    sx->remote_port = uVar10;
    uVar4 = *(undefined4 *)((long)&(conn->socks_proxy).user + 4);
    uVar5 = *(undefined4 *)&(conn->socks_proxy).passwd;
    uVar6 = *(undefined4 *)((long)&(conn->socks_proxy).passwd + 4);
    *(undefined4 *)&sx->proxy_user = *(undefined4 *)&(conn->socks_proxy).user;
    *(undefined4 *)((long)&sx->proxy_user + 4) = uVar4;
    *(undefined4 *)&sx->proxy_password = uVar5;
    *(undefined4 *)((long)&sx->proxy_password + 4) = uVar6;
    cVar19 = CONNECT_SOCKS_INIT;
  }
  pcVar2 = cf->conn;
  bVar24 = (pcVar2->socks_proxy).proxytype;
  uVar25 = (ulong)bVar24;
  switch(bVar24) {
  case 4:
  case 6:
    break;
  case 5:
  case 7:
    pcVar22 = sx->hostname;
    local_a8 = uVar25;
    local_98 = pcVar2;
    sVar15 = strlen(pcVar22);
    bVar24 = (data->set).socks5auth;
    dns = (Curl_dns_entry *)0x0;
    if (cVar19 - CONNECT_SOCKS_INIT < 0x10) {
      puVar1 = sx->buffer;
      switch(cVar19) {
      case CONNECT_SOCKS_INIT:
        if ((((uint)local_98->bits & 1) != 0) && (((data->set).field_0x8bd & 0x10) != 0)) {
          Curl_infof(data,"SOCKS5: connecting to HTTP proxy %s port %d",pcVar22);
        }
        if (((char)local_a8 == '\x05') || (sVar15 < 0x100)) {
          if (((bVar24 & 0xfa) != 0) && (((data->set).field_0x8bd & 0x10) != 0)) {
            Curl_infof(data,"warning: unsupported value passed to CURLOPT_SOCKS5_AUTH: %u",
                       (ulong)bVar24);
          }
          if ((bVar24 & 1) == 0) {
            sx->proxy_user = (char *)0x0;
            sx->buffer[0] = '\x05';
            sVar16 = 3;
            lVar14 = 0x12;
            uVar18 = '\0';
LAB_0063663d:
            sx->buffer[lVar14 + -0x10] = uVar18;
          }
          else {
            pcVar22 = sx->proxy_user;
            sx->buffer[0] = '\x05';
            sx->buffer[2] = '\0';
            if (pcVar22 != (char *)0x0) {
              sVar16 = 4;
              uVar18 = '\x02';
              lVar14 = 0x13;
              goto LAB_0063663d;
            }
            sVar16 = 3;
          }
          sx->buffer[1] = (char)sVar16 + 0xfe;
          sx->outp = puVar1;
          sx->outstanding = sVar16;
          CVar13 = socks_state_send(cf->next,sx,data,CURLPX_SEND_CONNECT,"initial SOCKS5 request");
          if (CVar13 != CURLPX_OK) goto LAB_00636ee0;
          if (sx->outstanding == 0) {
            if (sx->state != CONNECT_SOCKS_READ) {
              sx->state = CONNECT_SOCKS_READ;
            }
            goto switchD_00636001_caseD_3;
          }
          goto LAB_00636edd;
        }
        pcVar22 = 
        "SOCKS5: the destination hostname is too long to be resolved remotely by the proxy.";
LAB_0063650f:
        Curl_failf(data,pcVar22);
        CVar13 = CURLPX_LONG_HOSTNAME;
        goto LAB_00636ee0;
      case CONNECT_SOCKS_SEND:
        CVar13 = socks_state_send(cf->next,sx,data,CURLPX_SEND_CONNECT,"initial SOCKS5 request");
        if (CVar13 != CURLPX_OK) goto LAB_00636ee0;
        if (sx->outstanding == 0) goto switchD_00636001_caseD_3;
        goto LAB_00636edd;
      case CONNECT_SOCKS_READ_INIT:
switchD_00636001_caseD_3:
        sx->outstanding = 2;
        sx->outp = puVar1;
        break;
      case CONNECT_GSSAPI_INIT:
        goto switchD_00636001_caseD_5;
      case CONNECT_AUTH_INIT:
        goto switchD_00636001_caseD_6;
      case CONNECT_AUTH_SEND:
        goto switchD_00636001_caseD_7;
      case CONNECT_AUTH_READ:
        goto switchD_00636001_caseD_8;
      case CONNECT_REQ_INIT:
        goto switchD_00636001_caseD_9;
      case CONNECT_RESOLVING:
        dns = Curl_fetch_addr(data,pcVar22,sx->remote_port);
        if (dns != (Curl_dns_entry *)0x0) {
          if (((data->set).field_0x8bd & 0x10) != 0) {
            Curl_infof(data,"SOCKS5: hostname \'%s\' found",sx->hostname);
          }
          goto LAB_00636bd4;
        }
        CVar9 = Curl_resolv_check(data,&dns);
        if (dns == (Curl_dns_entry *)0x0) goto LAB_00636608;
        goto LAB_00636bde;
      case CONNECT_RESOLVED:
        goto switchD_00636001_caseD_b;
      case CONNECT_RESOLVE_REMOTE:
        sx->buffer[0] = '\x05';
        sx->buffer[1] = '\x01';
        sx->buffer[2] = '\0';
        lVar14 = 3;
        if ((char)local_a8 == '\x05') goto LAB_00636d39;
        goto LAB_00636aa4;
      case CONNECT_REQ_SEND:
        lVar14 = 0;
        goto LAB_00636d39;
      case CONNECT_REQ_SENDING:
        goto switchD_00636001_caseD_e;
      case CONNECT_REQ_READ:
        goto switchD_00636001_caseD_f;
      case CONNECT_REQ_READ_MORE:
        goto switchD_00636001_caseD_10;
      }
      CVar13 = socks_state_recv(cf->next,sx,data,CURLPX_RECV_CONNECT,"initial SOCKS5 response");
      if (CVar13 != CURLPX_OK) goto LAB_00636ee0;
      if (sx->outstanding != 0) goto LAB_00636edd;
      if (*puVar1 != '\x05') {
        pcVar22 = "Received invalid version in initial SOCKS5 response.";
        goto LAB_006364d7;
      }
      bVar24 = sx->buffer[1];
      if (bVar24 < 2) {
        if (bVar24 != 0) {
          if (bVar24 == 1) {
            Curl_failf(data,"SOCKS5 GSSAPI per-message authentication is not supported.");
            CVar13 = CURLPX_GSSAPI_PERMSG;
          }
          else {
LAB_00636872:
            Curl_failf(data,"Undocumented SOCKS5 mode attempted to be used by server.");
            CVar13 = CURLPX_UNKNOWN_MODE;
          }
          goto LAB_00636ee0;
        }
LAB_00636a7f:
        if (sx->state != CONNECT_REQ_INIT) {
          sx->state = CONNECT_REQ_INIT;
        }
switchD_00636001_caseD_9:
        if ((char)local_a8 == '\x05') {
          rVar12 = Curl_resolv(data,sx->hostname,sx->remote_port,true,&dns);
          if (rVar12 == CURLRESOLV_ERROR) goto LAB_00636cb0;
          if (rVar12 == CURLRESOLV_PENDING) {
            CVar13 = CURLPX_OK;
            if (sx->state != CONNECT_RESOLVING) {
              sx->state = CONNECT_RESOLVING;
            }
            goto LAB_00636ee0;
          }
          if (sx->state != CONNECT_RESOLVED) {
            sx->state = CONNECT_RESOLVED;
          }
LAB_00636bd4:
          if (dns == (Curl_dns_entry *)0x0) {
switchD_00636001_caseD_b:
            pCVar21 = (Curl_addrinfo *)0x0;
          }
          else {
LAB_00636bde:
            pCVar21 = dns->addr;
          }
          uVar18 = (data->set).ipver;
          if (uVar18 != '\0') {
            if (pCVar21 != (Curl_addrinfo *)0x0) {
              do {
                if (pCVar21->ai_family == (uint)(uVar18 != '\x01') * 8 + 2) goto LAB_00636c1f;
                pCVar21 = pCVar21->ai_next;
              } while (pCVar21 != (Curl_addrinfo *)0x0);
            }
LAB_00636c98:
            pcVar22 = sx->hostname;
            pcVar23 = "Failed to resolve \"%s\" for SOCKS5 connect.";
            goto LAB_00636ca6;
          }
          if (pCVar21 == (Curl_addrinfo *)0x0) goto LAB_00636c98;
LAB_00636c1f:
          Curl_printable_address(pCVar21,dest,0x2e);
          sx->buffer[0] = '\x05';
          sx->buffer[1] = '\x01';
          sx->buffer[2] = '\0';
          if (pCVar21->ai_family == 10) {
            sx->buffer[3] = '\x04';
            psVar3 = pCVar21->ai_addr;
            lVar14 = 0;
            do {
              sx->buffer[lVar14 + 4] = psVar3->sa_data[lVar14 + 6];
              lVar14 = lVar14 + 1;
            } while (lVar14 != 0x10);
            lVar14 = 0x14;
            if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
              uVar10 = sx->remote_port;
              pcVar22 = "SOCKS5 connect to [%s]:%d (locally resolved)";
LAB_00636cfb:
              Curl_infof(data,pcVar22,dest,(ulong)uVar10);
            }
          }
          else if (pCVar21->ai_family == 2) {
            sx->buffer[3] = '\x01';
            psVar3 = pCVar21->ai_addr;
            lVar14 = 0;
            do {
              sx->buffer[lVar14 + 4] = psVar3->sa_data[lVar14 + 2];
              lVar14 = lVar14 + 1;
            } while (lVar14 != 4);
            lVar14 = 8;
            if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
              uVar10 = sx->remote_port;
              pcVar22 = "SOCKS5 connect to %s:%d (locally resolved)";
              goto LAB_00636cfb;
            }
          }
          else {
            Curl_failf(data,"SOCKS5 connection to %s not supported",dest);
            lVar14 = 3;
          }
          Curl_resolv_unlock(data,dns);
LAB_00636d39:
          sx->buffer[lVar14] = *(uchar *)((long)&sx->remote_port + 1);
          sx->buffer[lVar14 + 1] = (uchar)sx->remote_port;
          sx->outp = puVar1;
          sx->outstanding = lVar14 + 2;
          if (sx->state != CONNECT_REQ_SENDING) {
            sx->state = CONNECT_REQ_SENDING;
          }
switchD_00636001_caseD_e:
          CVar13 = socks_state_send(cf->next,sx,data,CURLPX_SEND_REQUEST,"SOCKS5 connect request");
          if (CVar13 == CURLPX_OK) {
            if (sx->outstanding == 0) {
              sx->outstanding = 10;
              sx->outp = puVar1;
              if (sx->state != CONNECT_REQ_READ) {
                sx->state = CONNECT_REQ_READ;
              }
switchD_00636001_caseD_f:
              CVar13 = socks_state_recv(cf->next,sx,data,CURLPX_RECV_REQACK,
                                        "SOCKS5 connect request ack");
              if (CVar13 != CURLPX_OK) goto LAB_00636ee0;
              if (sx->outstanding == 0) {
                if (*puVar1 != '\x05') {
                  pcVar22 = "SOCKS5 reply has wrong version, version should be 5.";
                  goto LAB_006364d7;
                }
                bVar24 = sx->buffer[1];
                if (bVar24 != 0) {
                  Curl_failf(data,"Can\'t complete SOCKS5 connection to %s. (%d)",sx->hostname,
                             (ulong)bVar24);
                  CVar13 = CURLPX_REPLY_UNASSIGNED;
                  if (bVar24 < 9) {
                    CVar13 = *(CURLproxycode *)(do_SOCKS5_lookup + (ulong)bVar24 * 4);
                  }
                  goto LAB_00636ee0;
                }
                uVar18 = sx->buffer[3];
                if (uVar18 != '\x01') {
                  if (uVar18 == '\x03') {
                    if ((ulong)sx->buffer[4] < 4) goto LAB_00636f33;
                    lVar14 = (ulong)sx->buffer[4] + 7;
                  }
                  else {
                    lVar14 = 0x16;
                    if (uVar18 != '\x04') {
                      Curl_failf(data,"SOCKS5 reply has wrong address type.");
                      goto LAB_00636e75;
                    }
                  }
                  sx->outstanding = lVar14 + -10;
                  sx->outp = sx->buffer + 10;
                  if (sx->state != CONNECT_REQ_READ_MORE) {
                    sx->state = CONNECT_REQ_READ_MORE;
                  }
switchD_00636001_caseD_10:
                  CVar13 = socks_state_recv(cf->next,sx,data,CURLPX_RECV_ADDRESS,
                                            "SOCKS5 connect request address");
                  if (CVar13 != CURLPX_OK) goto LAB_00636ee0;
                  if (sx->outstanding != 0) goto LAB_00636edd;
                }
LAB_00636f33:
                if (sx->state != CONNECT_DONE) {
                  sx->state = CONNECT_DONE;
                }
                if (data != (Curl_easy *)0x0) goto switchD_00636001_caseD_5;
              }
            }
LAB_00636edd:
            CVar13 = CURLPX_OK;
          }
        }
        else {
          sx->buffer[0] = '\x05';
          sx->buffer[1] = '\x01';
          sx->buffer[2] = '\0';
LAB_00636aa4:
          if (((local_98->bits).field_0x1 & 8) == 0) {
            iVar11 = inet_pton(2,sx->hostname,ip4);
            if (iVar11 == 1) {
              sx->buffer[3] = '\x01';
              *(uchar (*) [4])(sx->buffer + 4) = ip4;
              lVar14 = 8;
            }
            else {
              sx->buffer[3] = '\x03';
              sx->buffer[4] = (uchar)sVar15;
              memcpy(sx->buffer + 5,sx->hostname,sVar15);
              lVar14 = sVar15 + 5;
            }
LAB_00636b93:
            if (((data->set).field_0x8bd & 0x10) != 0) {
              Curl_infof(data,"SOCKS5 connect to %s:%d (remotely resolved)",sx->hostname,
                         (ulong)(uint)sx->remote_port);
            }
            goto LAB_00636d39;
          }
          iVar11 = inet_pton(10,sx->hostname,dest);
          if (iVar11 == 1) {
            sx->buffer[3] = '\x04';
            *(undefined8 *)(sx->buffer + 4) = dest._0_8_;
            *(undefined8 *)(sx->buffer + 0xc) = dest._8_8_;
            lVar14 = 0x14;
            goto LAB_00636b93;
          }
LAB_00636e75:
          CVar13 = CURLPX_BAD_ADDRESS_TYPE;
        }
      }
      else if (bVar24 == 2) {
        if (sx->state != CONNECT_AUTH_INIT) {
          sx->state = CONNECT_AUTH_INIT;
        }
switchD_00636001_caseD_6:
        pcVar22 = sx->proxy_user;
        if ((pcVar22 == (char *)0x0) || (pcVar23 = sx->proxy_password, pcVar23 == (char *)0x0)) {
          sx->buffer[0] = '\x01';
          sx->buffer[1] = '\0';
          sx->buffer[2] = '\0';
          __n = 0;
          sVar17 = 3;
        }
        else {
          sVar17 = strlen(pcVar22);
          local_a0 = sVar17;
          __n = strlen(pcVar23);
          sx->buffer[0] = '\x01';
          sx->buffer[1] = (uchar)sVar17;
          if (sVar17 != 0) {
            if (0xff < sVar17) {
              pcVar22 = "Excessive user name length for proxy auth";
              goto LAB_006364f3;
            }
            memcpy(sx->buffer + 2,pcVar22,local_a0);
          }
          sVar17 = sVar17 + 3;
          sx->buffer[local_a0 + 2] = (uchar)__n;
          if (__n != 0 && sx->proxy_password != (char *)0x0) {
            if (0xff < __n) {
              Curl_failf(data,"Excessive password length for proxy auth");
              CVar13 = CURLPX_LONG_PASSWD;
              goto LAB_00636ee0;
            }
            local_a0 = sVar17;
            memcpy(puVar1 + sVar17,sx->proxy_password,__n);
            sVar17 = local_a0;
          }
        }
        if (sx->state != CONNECT_AUTH_SEND) {
          sx->state = CONNECT_AUTH_SEND;
        }
        sx->outstanding = sVar17 + __n;
        sx->outp = puVar1;
switchD_00636001_caseD_7:
        CVar13 = socks_state_send(cf->next,sx,data,CURLPX_SEND_AUTH,"SOCKS5 sub-negotiation request"
                                 );
        if (CVar13 == CURLPX_OK) {
          if (sx->outstanding != 0) goto LAB_00636edd;
          sx->outp = puVar1;
          sx->outstanding = 2;
          if (sx->state != CONNECT_AUTH_READ) {
            sx->state = CONNECT_AUTH_READ;
          }
switchD_00636001_caseD_8:
          CVar13 = socks_state_recv(cf->next,sx,data,CURLPX_RECV_AUTH,
                                    "SOCKS5 sub-negotiation response");
          if (CVar13 == CURLPX_OK) {
            if (sx->outstanding != 0) goto LAB_00636edd;
            if (sx->buffer[1] == '\0') goto LAB_00636a7f;
            Curl_failf(data,"User was rejected by the SOCKS5 server (%d %d).",(ulong)*puVar1);
            CVar13 = CURLPX_USER_REJECTED;
          }
        }
      }
      else {
        if (bVar24 != 0xff) goto LAB_00636872;
        Curl_failf(data,"No authentication method was acceptable.");
        CVar13 = CURLPX_NO_AUTH;
      }
    }
    else {
switchD_00636001_caseD_5:
      CVar13 = CURLPX_OK;
      if (((data->set).field_0x8bd & 0x10) != 0) {
        CVar13 = CURLPX_OK;
        Curl_infof(data,"SOCKS5 request granted.");
      }
    }
    goto LAB_00636ee0;
  default:
    Curl_failf(data,"unknown proxytype option given");
    CVar9 = CURLE_COULDNT_CONNECT;
    goto LAB_00636f28;
  }
  puVar1 = sx->buffer;
  dns = (Curl_dns_entry *)0x0;
  switch(cVar19) {
  case CONNECT_SOCKS_INIT:
    pcVar2->ip_version = '\x01';
    if ((data == (Curl_easy *)0x0) || (((uint)pcVar2->bits & 1) == 0)) {
      if (data != (Curl_easy *)0x0) goto LAB_00636107;
    }
    else {
      if (((data->set).field_0x8bd & 0x10) != 0) {
        pcVar22 = "";
        if (bVar24 == 6) {
          pcVar22 = "a";
        }
        Curl_infof(data,"SOCKS4%s: connecting to HTTP proxy %s port %d",pcVar22,sx->hostname,
                   (ulong)(uint)sx->remote_port);
      }
LAB_00636107:
      if (((data->set).field_0x8bd & 0x10) != 0) {
        Curl_infof(data,"SOCKS4 communication to %s:%d",sx->hostname,(ulong)(uint)sx->remote_port);
      }
    }
    iVar11 = sx->remote_port;
    uVar8 = (ushort)iVar11;
    sx->buffer[0] = '\x04';
    sx->buffer[1] = '\x01';
    *(ushort *)(sx->buffer + 2) = uVar8 << 8 | uVar8 >> 8;
    if (bVar24 == 6) {
      if (sx->state != CONNECT_REQ_INIT) {
        sx->state = CONNECT_REQ_INIT;
      }
      goto switchD_00635f4a_caseD_9;
    }
    rVar12 = Curl_resolv(data,sx->hostname,iVar11,true,&dns);
    if (rVar12 != CURLRESOLV_ERROR) {
      if (rVar12 != CURLRESOLV_PENDING) goto LAB_006361ca;
      if (sx->state != CONNECT_RESOLVING) {
        sx->state = CONNECT_RESOLVING;
      }
      CVar13 = CURLPX_OK;
      if ((data == (Curl_easy *)0x0) || (((data->set).field_0x8bd & 0x10) == 0)) break;
      pcVar22 = sx->hostname;
      pcVar23 = "SOCKS4 non-blocking resolve of %s";
LAB_0063657e:
      CVar13 = CURLPX_OK;
      Curl_infof(data,pcVar23,pcVar22);
      break;
    }
    goto LAB_00636cb0;
  default:
switchD_00635f4a_caseD_2:
    if (*puVar1 == '\0') {
      switch(sx->buffer[1]) {
      case 'Z':
        CVar13 = CURLPX_OK;
        if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
          pcVar22 = "";
          if (bVar24 == 6) {
            pcVar22 = "a";
          }
          pcVar23 = "SOCKS4%s request granted.";
          goto LAB_0063657e;
        }
        break;
      case '[':
        Curl_failf(data,
                   "Can\'t complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), request rejected or failed."
                   ,(ulong)sx->buffer[4],(ulong)sx->buffer[5],(ulong)sx->buffer[6],
                   (ulong)sx->buffer[7],
                   (ulong)(ushort)(*(ushort *)(sx->buffer + 2) << 8 |
                                  *(ushort *)(sx->buffer + 2) >> 8),0x5b);
        CVar13 = CURLPX_REQUEST_FAILED;
        break;
      case '\\':
        Curl_failf(data,
                   "Can\'t complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), request rejected because SOCKS server cannot connect to identd on the client."
                   ,(ulong)sx->buffer[4],(ulong)sx->buffer[5],(ulong)sx->buffer[6],
                   (ulong)sx->buffer[7],
                   (ulong)(ushort)(*(ushort *)(sx->buffer + 2) << 8 |
                                  *(ushort *)(sx->buffer + 2) >> 8),0x5c);
        CVar13 = CURLPX_IDENTD;
        break;
      case ']':
        Curl_failf(data,
                   "Can\'t complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), request rejected because the client program and identd report different user-ids."
                   ,(ulong)sx->buffer[4],(ulong)sx->buffer[5],(ulong)sx->buffer[6],
                   (ulong)sx->buffer[7],
                   (ulong)(ushort)(*(ushort *)(sx->buffer + 2) << 8 |
                                  *(ushort *)(sx->buffer + 2) >> 8),0x5d);
        CVar13 = CURLPX_IDENTD_DIFFER;
        break;
      default:
        Curl_failf(data,"Can\'t complete SOCKS4 connection to %d.%d.%d.%d:%d. (%d), Unknown.",
                   (ulong)sx->buffer[4],(ulong)sx->buffer[5],(ulong)sx->buffer[6],
                   (ulong)sx->buffer[7],
                   (ulong)(ushort)(*(ushort *)(sx->buffer + 2) << 8 |
                                  *(ushort *)(sx->buffer + 2) >> 8),(ulong)sx->buffer[1]);
        CVar13 = CURLPX_UNKNOWN_FAIL;
      }
      break;
    }
    pcVar22 = "SOCKS4 reply has wrong version, version should be 0.";
LAB_006364d7:
    Curl_failf(data,pcVar22);
    CVar13 = CURLPX_BAD_VERSION;
    break;
  case CONNECT_SOCKS_READ:
switchD_00635f4a_caseD_4:
    CVar13 = socks_state_recv(cf->next,sx,data,CURLPX_RECV_CONNECT,"connect request ack");
    if (CVar13 == CURLPX_OK) {
      if (sx->outstanding != 0) goto LAB_00636edd;
      if (sx->state != CONNECT_DONE) {
        sx->state = CONNECT_DONE;
      }
      goto switchD_00635f4a_caseD_2;
    }
    break;
  case CONNECT_REQ_INIT:
switchD_00635f4a_caseD_9:
    sx->buffer[8] = '\0';
    pcVar22 = sx->proxy_user;
    local_a8 = uVar25;
    if (pcVar22 == (char *)0x0) {
LAB_006363a3:
      sVar15 = strlen((char *)(sx->buffer + 8));
      uVar25 = sVar15 + 9;
      if ((char)local_a8 == '\x06') {
        sx->buffer[4] = '\0';
        sx->buffer[5] = '\0';
        sx->buffer[6] = '\0';
        sx->buffer[7] = '\x01';
        local_98 = (connectdata *)sx->hostname;
        sVar15 = strlen((char *)local_98);
        if ((0xff < sVar15 + 1) || (uVar20 = sVar15 + 1 + uVar25, 599 < uVar20)) {
          pcVar22 = "SOCKS4: too long host name";
          goto LAB_0063650f;
        }
        strcpy((char *)(puVar1 + uVar25),(char *)local_98);
        uVar25 = uVar20;
      }
      sx->outp = puVar1;
      sx->outstanding = uVar25;
      uVar25 = local_a8;
      if (sx->state != CONNECT_REQ_SENDING) {
        sx->state = CONNECT_REQ_SENDING;
      }
      goto switchD_00635f4a_caseD_e;
    }
    sVar15 = strlen(pcVar22);
    if (sVar15 < 0x100) {
      memcpy(sx->buffer + 8,pcVar22,sVar15 + 1);
      goto LAB_006363a3;
    }
    pcVar22 = "Too long SOCKS proxy user name";
LAB_006364f3:
    Curl_failf(data,pcVar22);
    CVar13 = CURLPX_LONG_USER;
    break;
  case CONNECT_RESOLVING:
    dns = Curl_fetch_addr(data,sx->hostname,pcVar2->port);
    if (dns == (Curl_dns_entry *)0x0) {
      CVar9 = Curl_resolv_check(data,&dns);
      if (dns != (Curl_dns_entry *)0x0) goto LAB_006362cf;
LAB_00636608:
      CVar13 = CURLPX_RESOLVE_HOST;
      if (CVar9 == CURLE_OK) {
        CVar13 = CURLPX_OK;
      }
      break;
    }
    if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
      Curl_infof(data,"Hostname \'%s\' was found",sx->hostname);
    }
LAB_006361ca:
    if (sx->state != CONNECT_RESOLVED) {
      sx->state = CONNECT_RESOLVED;
    }
    if (dns == (Curl_dns_entry *)0x0) goto switchD_00635f4a_caseD_b;
LAB_006362cf:
    for (pCVar21 = dns->addr; pCVar21 != (Curl_addrinfo *)0x0; pCVar21 = pCVar21->ai_next) {
      if (pCVar21->ai_family == 2) {
        Curl_printable_address(pCVar21,dest,0x40);
        psVar3 = pCVar21->ai_addr;
        sx->buffer[4] = psVar3->sa_data[2];
        sx->buffer[5] = psVar3->sa_data[3];
        sx->buffer[6] = psVar3->sa_data[4];
        sx->buffer[7] = psVar3->sa_data[5];
        if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
          Curl_infof(data,"SOCKS4 connect to IPv4 %s (locally resolved)",dest);
        }
        Curl_resolv_unlock(data,dns);
        goto switchD_00635f4a_caseD_9;
      }
    }
    pcVar22 = sx->hostname;
    pcVar23 = "SOCKS4 connection to %s not supported";
    goto LAB_00636ca6;
  case CONNECT_RESOLVED:
switchD_00635f4a_caseD_b:
    pcVar22 = sx->hostname;
    pcVar23 = "Failed to resolve \"%s\" for SOCKS4 connect.";
LAB_00636ca6:
    Curl_failf(data,pcVar23,pcVar22);
LAB_00636cb0:
    CVar13 = CURLPX_RESOLVE_HOST;
    break;
  case CONNECT_REQ_SENDING:
switchD_00635f4a_caseD_e:
    bVar24 = (byte)uVar25;
    CVar13 = socks_state_send(cf->next,sx,data,CURLPX_SEND_CONNECT,"SOCKS4 connect request");
    if (CVar13 == CURLPX_OK) {
      if (sx->outstanding != 0) goto LAB_00636edd;
      sx->outstanding = 8;
      sx->outp = puVar1;
      if (sx->state != CONNECT_SOCKS_READ) {
        sx->state = CONNECT_SOCKS_READ;
      }
      goto switchD_00635f4a_caseD_4;
    }
  }
LAB_00636ee0:
  if (CVar13 == CURLPX_OK) {
    CVar9 = CURLE_OK;
    if (sx->state == CONNECT_DONE) {
      cf->field_0x24 = cf->field_0x24 | 1;
      Curl_verboseconnect(data,conn);
      if (cf->ctx != (void *)0x0) {
        (*Curl_cfree)(cf->ctx);
        cf->ctx = (void *)0x0;
      }
    }
  }
  else {
    (data->info).pxcode = CVar13;
    CVar9 = CURLE_PROXY;
  }
LAB_00636f28:
  _Var7 = (_Bool)(cf->field_0x24 & 1);
LAB_00635e97:
  *done = _Var7;
  return CVar9;
}

Assistant:

static CURLcode socks_proxy_cf_connect(struct Curl_cfilter *cf,
                                       struct Curl_easy *data,
                                       bool blocking, bool *done)
{
  CURLcode result;
  struct connectdata *conn = cf->conn;
  int sockindex = cf->sockindex;
  struct socks_state *sx = cf->ctx;

  if(cf->connected) {
    *done = TRUE;
    return CURLE_OK;
  }

  result = cf->next->cft->do_connect(cf->next, data, blocking, done);
  if(result || !*done)
    return result;

  if(!sx) {
    sx = calloc(1, sizeof(*sx));
    if(!sx)
      return CURLE_OUT_OF_MEMORY;
    cf->ctx = sx;
  }

  if(sx->state == CONNECT_INIT) {
    /* for the secondary socket (FTP), use the "connect to host"
     * but ignore the "connect to port" (use the secondary port)
     */
    sxstate(sx, data, CONNECT_SOCKS_INIT);
    sx->hostname =
      conn->bits.httpproxy ?
      conn->http_proxy.host.name :
      conn->bits.conn_to_host ?
      conn->conn_to_host.name :
      sockindex == SECONDARYSOCKET ?
      conn->secondaryhostname : conn->host.name;
    sx->remote_port =
      conn->bits.httpproxy ? (int)conn->http_proxy.port :
      sockindex == SECONDARYSOCKET ? conn->secondary_port :
      conn->bits.conn_to_port ? conn->conn_to_port :
      conn->remote_port;
    sx->proxy_user = conn->socks_proxy.user;
    sx->proxy_password = conn->socks_proxy.passwd;
  }

  result = connect_SOCKS(cf, sx, data);
  if(!result && sx->state == CONNECT_DONE) {
    cf->connected = TRUE;
    Curl_verboseconnect(data, conn);
    socks_proxy_cf_free(cf);
  }

  *done = cf->connected;
  return result;
}